

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryManagement.h
# Opt level: O3

ObjectBase * __thiscall
chatra::Storage::derefDirect<chatra::ObjectBase>(Storage *this,size_t objectIndex)

{
  __atomic_flag_data_type _Var1;
  ObjectBase *pOVar2;
  undefined8 *puVar3;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  _Elt_pointer local_38 [4];
  size_t local_18;
  size_t objectIndex_local;
  
  do {
    LOCK();
    _Var1 = (this->lockObjects).flag.super___atomic_flag_base._M_i;
    (this->lockObjects).flag.super___atomic_flag_base._M_i = true;
    UNLOCK();
  } while (_Var1 != false);
  local_18 = objectIndex;
  if (objectIndex <
      (ulong)((long)(this->objects).
                    super__Vector_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->objects).
                    super__Vector_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3)) {
    local_78 = *(undefined4 *)
                &(this->recycledObjectIndexes).
                 super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur;
    uStack_74 = *(undefined4 *)
                 ((long)&(this->recycledObjectIndexes).
                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Deque_impl_data._M_start._M_cur + 4);
    uStack_70 = *(undefined4 *)
                 &(this->recycledObjectIndexes).
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_start._M_first;
    uStack_6c = *(undefined4 *)
                 ((long)&(this->recycledObjectIndexes).
                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Deque_impl_data._M_start._M_first + 4);
    local_68 = *(undefined4 *)
                &(this->recycledObjectIndexes).
                 super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Deque_impl_data._M_start._M_last;
    uStack_64 = *(undefined4 *)
                 ((long)&(this->recycledObjectIndexes).
                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Deque_impl_data._M_start._M_last + 4);
    uStack_60 = *(undefined4 *)
                 &(this->recycledObjectIndexes).
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_start._M_node;
    uStack_5c = *(undefined4 *)
                 ((long)&(this->recycledObjectIndexes).
                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Deque_impl_data._M_start._M_node + 4);
    local_58 = *(undefined4 *)
                &(this->recycledObjectIndexes).
                 super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
    uStack_54 = *(undefined4 *)
                 ((long)&(this->recycledObjectIndexes).
                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_cur + 4);
    uStack_50 = *(undefined4 *)
                 &(this->recycledObjectIndexes).
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first;
    uStack_4c = *(undefined4 *)
                 ((long)&(this->recycledObjectIndexes).
                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_first + 4);
    local_48 = *(undefined4 *)
                &(this->recycledObjectIndexes).
                 super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_last;
    uStack_44 = *(undefined4 *)
                 ((long)&(this->recycledObjectIndexes).
                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_last + 4);
    uStack_40 = *(undefined4 *)
                 &(this->recycledObjectIndexes).
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_node;
    uStack_3c = *(undefined4 *)
                 ((long)&(this->recycledObjectIndexes).
                         super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Deque_impl_data._M_finish._M_node + 4);
    std::
    __find_if<std::_Deque_iterator<unsigned_long,unsigned_long_const&,unsigned_long_const*>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
              (local_38,&local_78,&local_58,&local_18);
    if (local_38[0] ==
        (this->recycledObjectIndexes).
        super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur) {
      pOVar2 = (ObjectBase *)
               (this->objects).
               super__Vector_base<chatra::Object_*,_std::allocator<chatra::Object_*>_>._M_impl.
               super__Vector_impl_data._M_start[local_18];
      (this->lockObjects).flag.super___atomic_flag_base._M_i = false;
      return pOVar2;
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[1] = puVar3 + 3;
  *(undefined1 *)(puVar3 + 3) = 0;
  *puVar3 = &PTR__NativeException_00242de8;
  __cxa_throw(puVar3,&IllegalArgumentException::typeinfo,NativeException::~NativeException);
}

Assistant:

Type& Storage::derefDirect(size_t objectIndex) const {
	static_assert(std::is_base_of<Object, Type>::value, "Type should be derived class of Object");
	std::lock_guard<SpinLock> lock0(lockObjects);

	if (objectIndex >= objects.size() ||
			std::find(recycledObjectIndexes.cbegin(), recycledObjectIndexes.cend(), objectIndex) != recycledObjectIndexes.cend())
		throw IllegalArgumentException();

	return *static_cast<Type*>(objects[objectIndex]);
}